

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::writeOptions(Highs *this,string *filename,bool report_only_deviations)

{
  HighsLogOptions *log_options_;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  pointer pcVar2;
  HighsStatus HVar3;
  int iVar4;
  HighsStatus call_status;
  undefined7 in_register_00000011;
  HighsFileType file_type;
  FILE *file;
  HighsFileType local_170;
  undefined4 local_16c;
  string local_168;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *local_148;
  FILE *local_140;
  string local_138;
  string local_118;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_98.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_98.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  pfVar1 = &local_98.user_callback;
  local_148 = &(this->options_).super_HighsOptionsStruct.log_options.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar1,local_148);
  local_98.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_98.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar2 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + filename->_M_string_length);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"writeOptions","");
  HVar3 = openWriteFile(this,&local_118,&local_138,(FILE **)&local_140,&local_170);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"openWriteFile","");
  HVar3 = interpretCallStatus(&local_98,HVar3,kOk,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (HVar3 == kError) {
    HVar3 = kError;
  }
  else {
    local_16c = (undefined4)CONCAT71(in_register_00000011,report_only_deviations);
    iVar4 = std::__cxx11::string::compare((char *)filename);
    if (iVar4 == 0) {
      local_170 = kMinimal;
    }
    log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
    iVar4 = std::__cxx11::string::compare((char *)filename);
    if (iVar4 != 0) {
      highsLogUser(log_options_,kInfo,"Writing the option values to %s\n",
                   (filename->_M_dataplus)._M_p);
    }
    local_f8.log_stream = log_options_->log_stream;
    local_f8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
    local_f8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
    local_f8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
    local_f8.user_log_callback =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
    local_f8.user_log_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
    pfVar1 = &local_f8.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar1,local_148);
    local_f8.user_callback_active =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
    local_f8.user_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
    call_status = writeOptionsToFile((FILE *)local_140,log_options_,&(this->options_).records,
                                     local_16c._0_1_,local_170);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"writeOptionsToFile","");
    HVar3 = interpretCallStatus(&local_f8,call_status,HVar3,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_f8.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    if (local_140 != _stdout) {
      fclose(local_140);
    }
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::writeOptions(const std::string& filename,
                                const bool report_only_deviations) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  FILE* file;
  HighsFileType file_type;
  return_status = interpretCallStatus(
      options_.log_options,
      openWriteFile(filename, "writeOptions", file, file_type), return_status,
      "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  if (filename == "") file_type = HighsFileType::kMinimal;
  // Report to user that options are being written to a file
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the option values to %s\n", filename.c_str());
  return_status = interpretCallStatus(
      options_.log_options,
      writeOptionsToFile(file, options_.log_options, options_.records,
                         report_only_deviations, file_type),
      return_status, "writeOptionsToFile");
  if (file != stdout) fclose(file);
  return return_status;
}